

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int test_aes128_cmac_prf(int verbose)

{
  int iVar1;
  ulong uVar2;
  size_t *psVar3;
  uchar (*pauVar4) [16];
  undefined1 auVar5 [16];
  uchar output [16];
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  pauVar4 = PRFT;
  psVar3 = PRFKlen;
  uVar2 = 0;
  do {
    printf("  AES CMAC 128 PRF #%u: ",uVar2 & 0xffffffff);
    iVar1 = mbedtls_aes_cmac_prf_128("",*psVar3,"",0x14,&local_48);
    if ((iVar1 != 0) ||
       (auVar5[0] = -((*pauVar4)[0] == local_48), auVar5[1] = -((*pauVar4)[1] == uStack_47),
       auVar5[2] = -((*pauVar4)[2] == uStack_46), auVar5[3] = -((*pauVar4)[3] == uStack_45),
       auVar5[4] = -((*pauVar4)[4] == uStack_44), auVar5[5] = -((*pauVar4)[5] == uStack_43),
       auVar5[6] = -((*pauVar4)[6] == uStack_42), auVar5[7] = -((*pauVar4)[7] == uStack_41),
       auVar5[8] = -((*pauVar4)[8] == uStack_40), auVar5[9] = -((*pauVar4)[9] == uStack_3f),
       auVar5[10] = -((*pauVar4)[10] == uStack_3e), auVar5[0xb] = -((*pauVar4)[0xb] == uStack_3d),
       auVar5[0xc] = -((*pauVar4)[0xc] == uStack_3c), auVar5[0xd] = -((*pauVar4)[0xd] == uStack_3b),
       auVar5[0xe] = -((*pauVar4)[0xe] == uStack_3a), auVar5[0xf] = -((*pauVar4)[0xf] == uStack_39),
       (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
       != 0xffff)) {
      if (verbose == 0) {
        return iVar1;
      }
      puts("failed");
      return iVar1;
    }
    if (verbose != 0) {
      puts("passed");
    }
    uVar2 = uVar2 + 1;
    pauVar4 = pauVar4 + 1;
    psVar3 = psVar3 + 1;
  } while (uVar2 != 3);
  return 0;
}

Assistant:

static int test_aes128_cmac_prf( int verbose )
{
    int i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output[MBEDTLS_AES_BLOCK_SIZE];

    for( i = 0; i < NB_PRF_TESTS; i++ )
    {
        mbedtls_printf( "  AES CMAC 128 PRF #%u: ", i );
        ret = mbedtls_aes_cmac_prf_128( PRFK, PRFKlen[i], PRFM, 20, output );
        if( ret != 0 ||
            memcmp( output, PRFT[i], MBEDTLS_AES_BLOCK_SIZE ) != 0 )
        {

            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( ret );
        }
        else if( verbose != 0 )
        {
            mbedtls_printf( "passed\n" );
        }
    }
    return( ret );
}